

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  LogMessage *pLVar1;
  Arena **v1;
  Arena **v2;
  undefined1 auVar2 [16];
  LogMessageFatal local_d0 [23];
  Voidify local_b9;
  string *local_b8;
  string *absl_log_internal_check_op_result_1;
  uint32_t mask;
  bool rhs_arena_dtor_registered;
  bool lhs_arena_dtor_registered;
  uint32_t *rhs_state;
  uint32_t *lhs_state;
  uint32_t *rhs_array;
  uint32_t *lhs_array;
  undefined8 local_80;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  uint local_60;
  uint local_5c;
  string *local_58;
  string *absl_log_internal_check_op_result;
  InlinedStringField *pIStack_48;
  uint32_t index;
  InlinedStringField *rhs_string;
  InlinedStringField *lhs_string;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  lhs_arena = (Arena *)field;
  field_local = (FieldDescriptor *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)r;
  rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
  lhs_string = (InlinedStringField *)MessageLite::GetArena((MessageLite *)field_local);
  rhs_string = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>
                         ((Reflection *)lhs_local,rhs_local,(FieldDescriptor *)lhs_arena);
  pIStack_48 = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>
                         ((Reflection *)lhs_local,(Message *)field_local,
                          (FieldDescriptor *)lhs_arena);
  absl_log_internal_check_op_result._4_4_ =
       ReflectionSchema::InlinedStringIndex
                 ((ReflectionSchema *)&(lhs_local->super_MessageLite)._internal_metadata_,
                  (FieldDescriptor *)lhs_arena);
  local_5c = absl::lts_20240722::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._4_4_);
  local_60 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_58 = absl::lts_20240722::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                       (&local_5c,&local_60,"index > 0u");
  if (local_58 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_80 = auVar2._8_8_;
    lhs_array = auVar2._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x29a,lhs_array,local_80);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  rhs_array = Reflection::MutableInlinedStringDonatedArray((Reflection *)lhs_local,rhs_local);
  lhs_state = Reflection::MutableInlinedStringDonatedArray
                        ((Reflection *)lhs_local,(Message *)field_local);
  rhs_state = rhs_array + (absl_log_internal_check_op_result._4_4_ >> 5);
  _mask = lhs_state + (absl_log_internal_check_op_result._4_4_ >> 5);
  absl_log_internal_check_op_result_1._7_1_ = (*rhs_array & 1) == 0;
  absl_log_internal_check_op_result_1._6_1_ = (*lhs_state & 1) == 0;
  absl_log_internal_check_op_result_1._0_4_ =
       1 << ((byte)absl_log_internal_check_op_result._4_4_ & 0x1f) ^ 0xffffffff;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&rhs_arena)
  ;
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                 ((Arena **)&lhs_string);
  local_b8 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                       (v1,v2,"lhs_arena == rhs_arena");
  if (local_b8 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x2a3,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_d0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_b9,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_d0);
  }
  InlinedStringField::InternalSwap
            (rhs_string,(bool)(absl_log_internal_check_op_result_1._7_1_ & 1),
             &rhs_local->super_MessageLite,pIStack_48,
             (bool)(absl_log_internal_check_op_result_1._6_1_ & 1),(MessageLite *)field_local,
             rhs_arena);
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  uint32_t index = r->schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  uint32_t* lhs_array = r->MutableInlinedStringDonatedArray(lhs);
  uint32_t* rhs_array = r->MutableInlinedStringDonatedArray(rhs);
  uint32_t* lhs_state = &lhs_array[index / 32];
  uint32_t* rhs_state = &rhs_array[index / 32];
  bool lhs_arena_dtor_registered = (lhs_array[0] & 0x1u) == 0;
  bool rhs_arena_dtor_registered = (rhs_array[0] & 0x1u) == 0;
  const uint32_t mask = ~(static_cast<uint32_t>(1) << (index % 32));
  if (unsafe_shallow_swap) {
    ABSL_DCHECK_EQ(lhs_arena, rhs_arena);
    InlinedStringField::InternalSwap(lhs_string, lhs_arena_dtor_registered, lhs,
                                     rhs_string, rhs_arena_dtor_registered, rhs,
                                     lhs_arena);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask,
                    lhs);
    rhs_string->Set(temp, rhs_arena, r->IsInlinedStringDonated(*rhs, field),
                    rhs_state, mask, rhs);
  }
}